

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O1

void compareB44(int width,int height,Array2D<Imf_3_4::Rgba> *p1,Array2D<Imf_3_4::Rgba> *p2,
               RgbaChannels channels)

{
  float fVar1;
  long lVar2;
  long lVar3;
  Rgba *pRVar4;
  bool bVar5;
  half *phVar6;
  Rgba *pRVar7;
  half *phVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  half B [4] [4];
  half A [4] [4];
  half local_78 [16];
  half local_58 [20];
  
  if ((channels & WRITE_R) == 0) {
    if (0 < height) {
      pRVar7 = p2->_data;
      uVar12 = 0;
      do {
        if (0 < width) {
          uVar15 = 0;
          do {
            fVar1 = *(float *)(_imath_half_to_float_table + (ulong)pRVar7[uVar15].r._h * 4);
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              __assert_fail("p2[y][x].r == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                            ,0xed,
                            "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                           );
            }
            uVar15 = uVar15 + 1;
          } while ((uint)width != uVar15);
        }
        uVar12 = uVar12 + 1;
        pRVar7 = pRVar7 + p2->_sizeY;
      } while (uVar12 != (uint)height);
    }
  }
  else if (0 < height) {
    lVar2 = p1->_sizeY;
    pRVar7 = p1->_data;
    lVar3 = p2->_sizeY;
    pRVar4 = p2->_data;
    uVar10 = 0;
    do {
      if (0 < width) {
        iVar16 = 0;
        do {
          phVar6 = local_78;
          phVar8 = local_58;
          lVar9 = 0;
          do {
            uVar11 = (uint)lVar9 | uVar10;
            if ((int)(height - 1U) < (int)uVar11) {
              uVar11 = height - 1U;
            }
            lVar13 = 0;
            do {
              iVar14 = iVar16 + (int)lVar13;
              if (width + -1 < iVar14) {
                iVar14 = width + -1;
              }
              phVar8[lVar13]._h = pRVar7[lVar2 * (int)uVar11 + (long)iVar14].r._h;
              phVar6[lVar13]._h = pRVar4[(int)uVar11 * lVar3 + (long)iVar14].r._h;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            lVar9 = lVar9 + 1;
            phVar8 = phVar8 + 4;
            phVar6 = phVar6 + 4;
          } while (lVar9 != 4);
          bVar5 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
          if (!bVar5) {
            __assert_fail("withinB44ErrorBounds (A, B)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                          ,0xe5,
                          "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                         );
          }
          iVar16 = iVar16 + 4;
        } while (iVar16 < width);
      }
      uVar10 = uVar10 + 4;
    } while ((int)uVar10 < height);
  }
  if ((channels & WRITE_G) == 0) {
    if (0 < height) {
      phVar6 = &p2->_data->g;
      uVar12 = 0;
      do {
        if (0 < width) {
          uVar15 = 0;
          do {
            fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar6[uVar15 * 4]._h * 4);
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              __assert_fail("p2[y][x].g == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                            ,0x10c,
                            "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                           );
            }
            uVar15 = uVar15 + 1;
          } while ((uint)width != uVar15);
        }
        uVar12 = uVar12 + 1;
        phVar6 = phVar6 + p2->_sizeY * 4;
      } while (uVar12 != (uint)height);
    }
  }
  else if (0 < height) {
    lVar2 = p1->_sizeY;
    pRVar7 = p1->_data;
    lVar3 = p2->_sizeY;
    pRVar4 = p2->_data;
    uVar10 = 0;
    do {
      if (0 < width) {
        iVar16 = 0;
        do {
          phVar6 = local_78;
          phVar8 = local_58;
          lVar9 = 0;
          do {
            uVar11 = (uint)lVar9 | uVar10;
            if ((int)(height - 1U) < (int)uVar11) {
              uVar11 = height - 1U;
            }
            lVar13 = 0;
            do {
              iVar14 = iVar16 + (int)lVar13;
              if (width + -1 < iVar14) {
                iVar14 = width + -1;
              }
              phVar8[lVar13]._h = pRVar7[lVar2 * (int)uVar11 + (long)iVar14].g._h;
              phVar6[lVar13]._h = pRVar4[(int)uVar11 * lVar3 + (long)iVar14].g._h;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            lVar9 = lVar9 + 1;
            phVar8 = phVar8 + 4;
            phVar6 = phVar6 + 4;
          } while (lVar9 != 4);
          bVar5 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
          if (!bVar5) {
            __assert_fail("withinB44ErrorBounds (A, B)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                          ,0x104,
                          "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                         );
          }
          iVar16 = iVar16 + 4;
        } while (iVar16 < width);
      }
      uVar10 = uVar10 + 4;
    } while ((int)uVar10 < height);
  }
  if ((channels & WRITE_B) == 0) {
    if (0 < height) {
      phVar6 = &p2->_data->b;
      uVar12 = 0;
      do {
        if (0 < width) {
          uVar15 = 0;
          do {
            fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar6[uVar15 * 4]._h * 4);
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              __assert_fail("p2[y][x].b == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                            ,299,
                            "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                           );
            }
            uVar15 = uVar15 + 1;
          } while ((uint)width != uVar15);
        }
        uVar12 = uVar12 + 1;
        phVar6 = phVar6 + p2->_sizeY * 4;
      } while (uVar12 != (uint)height);
    }
  }
  else if (0 < height) {
    lVar2 = p1->_sizeY;
    pRVar7 = p1->_data;
    lVar3 = p2->_sizeY;
    pRVar4 = p2->_data;
    uVar10 = 0;
    do {
      if (0 < width) {
        iVar16 = 0;
        do {
          phVar6 = local_78;
          phVar8 = local_58;
          lVar9 = 0;
          do {
            uVar11 = (uint)lVar9 | uVar10;
            if ((int)(height - 1U) < (int)uVar11) {
              uVar11 = height - 1U;
            }
            lVar13 = 0;
            do {
              iVar14 = iVar16 + (int)lVar13;
              if (width + -1 < iVar14) {
                iVar14 = width + -1;
              }
              phVar8[lVar13]._h = pRVar7[lVar2 * (int)uVar11 + (long)iVar14].b._h;
              phVar6[lVar13]._h = pRVar4[(int)uVar11 * lVar3 + (long)iVar14].b._h;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            lVar9 = lVar9 + 1;
            phVar8 = phVar8 + 4;
            phVar6 = phVar6 + 4;
          } while (lVar9 != 4);
          bVar5 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
          if (!bVar5) {
            __assert_fail("withinB44ErrorBounds (A, B)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                          ,0x123,
                          "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                         );
          }
          iVar16 = iVar16 + 4;
        } while (iVar16 < width);
      }
      uVar10 = uVar10 + 4;
    } while ((int)uVar10 < height);
  }
  if ((channels & WRITE_A) == 0) {
    if (0 < height) {
      phVar6 = &p2->_data->a;
      uVar12 = 0;
      do {
        if (0 < width) {
          uVar15 = 0;
          do {
            fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar6[uVar15 * 4]._h * 4);
            if ((fVar1 != 1.0) || (NAN(fVar1))) {
              __assert_fail("p2[y][x].a == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                            ,0x14a,
                            "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                           );
            }
            uVar15 = uVar15 + 1;
          } while ((uint)width != uVar15);
        }
        uVar12 = uVar12 + 1;
        phVar6 = phVar6 + p2->_sizeY * 4;
      } while (uVar12 != (uint)height);
    }
  }
  else if (0 < height) {
    lVar2 = p1->_sizeY;
    pRVar7 = p1->_data;
    lVar3 = p2->_sizeY;
    pRVar4 = p2->_data;
    uVar10 = 0;
    do {
      if (0 < width) {
        iVar16 = 0;
        do {
          phVar6 = local_78;
          phVar8 = local_58;
          lVar9 = 0;
          do {
            uVar11 = (uint)lVar9 | uVar10;
            if ((int)(height - 1U) < (int)uVar11) {
              uVar11 = height - 1U;
            }
            lVar13 = 0;
            do {
              iVar14 = iVar16 + (int)lVar13;
              if (width + -1 < iVar14) {
                iVar14 = width + -1;
              }
              phVar8[lVar13]._h = pRVar7[lVar2 * (int)uVar11 + (long)iVar14].a._h;
              phVar6[lVar13]._h = pRVar4[(int)uVar11 * lVar3 + (long)iVar14].a._h;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            lVar9 = lVar9 + 1;
            phVar8 = phVar8 + 4;
            phVar6 = phVar6 + 4;
          } while (lVar9 != 4);
          bVar5 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
          if (!bVar5) {
            __assert_fail("withinB44ErrorBounds (A, B)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                          ,0x142,
                          "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                         );
          }
          iVar16 = iVar16 + 4;
        } while (iVar16 < width);
      }
      uVar10 = uVar10 + 4;
    } while ((int)uVar10 < height);
  }
  return;
}

Assistant:

void
compareB44 (
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    const Array2D<Rgba>& p2,
    RgbaChannels         channels)
{
    if (channels & WRITE_R)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].r;
                        B[y1][x1] = p2[y2][x2].r;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].r == 0);
    }

    if (channels & WRITE_G)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].g;
                        B[y1][x1] = p2[y2][x2].g;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].g == 0);
    }

    if (channels & WRITE_B)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].b;
                        B[y1][x1] = p2[y2][x2].b;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].b == 0);
    }

    if (channels & WRITE_A)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].a;
                        B[y1][x1] = p2[y2][x2].a;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].a == 1);
    }
}